

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

bool __thiscall
duckdb::BinaryLambdaWrapper::
Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
          (BinaryLambdaWrapper *this,anon_class_16_2_9a274d3c fun,string_t left,string_t right,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  pointer this_00;
  string local_80;
  string local_60;
  anon_union_16_2_67f50693_for_value local_40;
  anon_union_16_2_67f50693_for_value local_30;
  
  local_40._0_8_ = left.value._8_8_;
  local_30.pointer.ptr = (char *)left.value._0_8_;
  local_30._0_8_ = fun.context;
  local_40.pointer.ptr = (char *)mask;
  this_00 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)this);
  string_t::GetString_abi_cxx11_(&local_60,(string_t *)&local_30.pointer);
  string_t::GetString_abi_cxx11_(&local_80,(string_t *)&local_40.pointer);
  bVar1 = CatalogSearchPath::SchemaInSearchPath
                    (this_00,(ClientContext *)fun.search_path,&local_60,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}